

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O0

UBool __thiscall icu_63::Calendar::isWeekend(Calendar *this)

{
  UBool UVar1;
  uint uVar2;
  int iVar3;
  int32_t iVar4;
  int iVar5;
  bool local_3d;
  int32_t transitionMillis;
  int32_t millisInDay;
  UCalendarWeekdayType dayType;
  UCalendarDaysOfWeek dayOfWeek;
  UErrorCode status;
  Calendar *this_local;
  
  dayType = UCAL_WEEKDAY;
  _dayOfWeek = this;
  uVar2 = get(this,UCAL_DAY_OF_WEEK,(UErrorCode *)&dayType);
  iVar3 = (*(this->super_UObject)._vptr_UObject[0x18])(this,(ulong)uVar2,&dayType);
  UVar1 = ::U_SUCCESS(dayType);
  if (UVar1 != '\0') {
    if (iVar3 == 0) {
      return '\0';
    }
    if (iVar3 == 1) {
      return '\x01';
    }
    if (iVar3 - 2U < 2) {
      iVar4 = internalGet(this,UCAL_MILLISECONDS_IN_DAY);
      iVar5 = (*(this->super_UObject)._vptr_UObject[0x19])(this,(ulong)uVar2,&dayType);
      UVar1 = ::U_SUCCESS(dayType);
      if (UVar1 != '\0') {
        if (iVar3 == 2) {
          local_3d = iVar5 <= iVar4;
        }
        else {
          local_3d = iVar4 < iVar5;
        }
        return local_3d;
      }
    }
  }
  return '\0';
}

Assistant:

UBool
Calendar::isWeekend(void) const
{
    UErrorCode status = U_ZERO_ERROR;
    UCalendarDaysOfWeek dayOfWeek = (UCalendarDaysOfWeek)get(UCAL_DAY_OF_WEEK, status);
    UCalendarWeekdayType dayType = getDayOfWeekType(dayOfWeek, status);
    if (U_SUCCESS(status)) {
        switch (dayType) {
            case UCAL_WEEKDAY:
                return FALSE;
            case UCAL_WEEKEND:
                return TRUE;
            case UCAL_WEEKEND_ONSET:
            case UCAL_WEEKEND_CEASE:
                // Use internalGet() because the above call to get() populated all fields.
                {
                    int32_t millisInDay = internalGet(UCAL_MILLISECONDS_IN_DAY);
                    int32_t transitionMillis = getWeekendTransition(dayOfWeek, status);
                    if (U_SUCCESS(status)) {
                        return (dayType == UCAL_WEEKEND_ONSET)?
                            (millisInDay >= transitionMillis):
                            (millisInDay <  transitionMillis);
                    }
                    // else fall through, return FALSE
                    U_FALLTHROUGH;
                }
            default:
                break;
        }
    }
    return FALSE;
}